

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O2

CURLcode doh_run_probe(Curl_easy *data,doh_probe *p,DNStype dnstype,char *host,char *url,
                      CURLM *multi,curl_slist *headers)

{
  dynbuf *s;
  undefined1 *puVar1;
  FILE *pFVar2;
  curl_trc_feat *pcVar3;
  Curl_easy *pCVar4;
  doh_probe *pdVar5;
  CURLcode CVar6;
  CURLMcode CVar7;
  size_t sVar8;
  char *pcVar9;
  timediff_t tVar10;
  undefined8 uVar11;
  uchar *puVar12;
  Curl_easy *doh;
  Curl_easy *local_58;
  uchar *local_50;
  doh_probe *local_48;
  CURLM *local_40;
  char *local_38;
  
  doh = (Curl_easy *)0x0;
  sVar8 = strlen(host);
  if (0x110 < (sVar8 - (host[sVar8 - 1] == '.')) + 0x12) {
    uVar11 = 0xd;
LAB_001238c7:
    Curl_failf(data,"Failed to encode DoH packet [%d]",uVar11);
    return CURLE_OUT_OF_MEMORY;
  }
  local_50 = p->req_body;
  p->req_body[0] = '\0';
  p->req_body[1] = '\0';
  p->req_body[2] = '\x01';
  p->req_body[3] = '\0';
  p->req_body[4] = '\0';
  p->req_body[5] = '\x01';
  puVar12 = p->req_body + 0xc;
  p->req_body[6] = '\0';
  p->req_body[7] = '\0';
  p->req_body[8] = '\0';
  p->req_body[9] = '\0';
  p->req_body[10] = '\0';
  p->req_body[0xb] = '\0';
  local_58 = data;
  local_48 = p;
  local_40 = multi;
  local_38 = url;
  for (; pdVar5 = local_48, *host != '\0';
      host = host + ((sVar8 + 1) - (ulong)(pcVar9 == (char *)0x0))) {
    pcVar9 = strchr(host,0x2e);
    if (pcVar9 == (char *)0x0) {
      sVar8 = strlen(host);
    }
    else {
      sVar8 = (long)pcVar9 - (long)host;
    }
    if (0x3e < sVar8 - 1) {
      local_48->req_body_len = 0;
      uVar11 = 1;
      data = local_58;
      goto LAB_001238c7;
    }
    *puVar12 = (uchar)sVar8;
    memcpy(puVar12 + 1,host,sVar8);
    puVar12 = puVar12 + sVar8 + 1;
  }
  puVar12[0] = '\0';
  puVar12[1] = '\0';
  puVar12[2] = (uchar)dnstype;
  puVar12[3] = '\0';
  puVar12[4] = '\x01';
  local_48->req_body_len = (size_t)(puVar12 + (5 - (long)local_50));
  local_48->dnstype = dnstype;
  s = &local_48->resp_body;
  Curl_dyn_init(s,3000);
  tVar10 = Curl_timeleft(local_58,(curltime *)0x0,true);
  if (tVar10 < 1) {
    CVar6 = CURLE_OPERATION_TIMEDOUT;
  }
  else {
    CVar6 = Curl_open(&doh);
    if (CVar6 == CURLE_OK) {
      puVar1 = &(doh->state).field_0x7be;
      *(uint *)puVar1 = *(uint *)puVar1 | 0x100000;
      (doh->state).feat = &Curl_trc_feat_dns;
      CVar6 = curl_easy_setopt(doh,CURLOPT_URL,local_38);
      if ((CVar6 < CURLE_SETOPT_OPTION_SYNTAX) &&
         ((0x1000000000011U >> ((ulong)CVar6 & 0x3f) & 1) != 0)) {
        CVar6 = curl_easy_setopt(doh,CURLOPT_DEFAULT_PROTOCOL,"https");
        if ((CVar6 < CURLE_SETOPT_OPTION_SYNTAX) &&
           ((0x1000000000011U >> ((ulong)CVar6 & 0x3f) & 1) != 0)) {
          CVar6 = curl_easy_setopt(doh,CURLOPT_WRITEFUNCTION,doh_write_cb);
          if ((CVar6 < CURLE_SETOPT_OPTION_SYNTAX) &&
             ((0x1000000000011U >> ((ulong)CVar6 & 0x3f) & 1) != 0)) {
            CVar6 = curl_easy_setopt(doh,CURLOPT_WRITEDATA,s);
            if ((CVar6 < CURLE_SETOPT_OPTION_SYNTAX) &&
               ((0x1000000000011U >> ((ulong)CVar6 & 0x3f) & 1) != 0)) {
              CVar6 = curl_easy_setopt(doh,CURLOPT_POSTFIELDS,local_50);
              if ((CVar6 < CURLE_SETOPT_OPTION_SYNTAX) &&
                 ((0x1000000000011U >> ((ulong)CVar6 & 0x3f) & 1) != 0)) {
                CVar6 = curl_easy_setopt(doh,CURLOPT_POSTFIELDSIZE,pdVar5->req_body_len);
                if ((CVar6 < CURLE_SETOPT_OPTION_SYNTAX) &&
                   ((0x1000000000011U >> ((ulong)CVar6 & 0x3f) & 1) != 0)) {
                  CVar6 = curl_easy_setopt(doh,CURLOPT_HTTPHEADER,headers);
                  if ((CVar6 < CURLE_SETOPT_OPTION_SYNTAX) &&
                     ((0x1000000000011U >> ((ulong)CVar6 & 0x3f) & 1) != 0)) {
                    CVar6 = curl_easy_setopt(doh,CURLOPT_PROTOCOLS,2);
                    if ((CVar6 < CURLE_SETOPT_OPTION_SYNTAX) &&
                       ((0x1000000000011U >> ((ulong)CVar6 & 0x3f) & 1) != 0)) {
                      CVar6 = curl_easy_setopt(doh,CURLOPT_TIMEOUT_MS,tVar10);
                      if ((CVar6 < CURLE_SETOPT_OPTION_SYNTAX) &&
                         ((0x1000000000011U >> ((ulong)CVar6 & 0x3f) & 1) != 0)) {
                        CVar6 = curl_easy_setopt(doh,CURLOPT_SHARE,local_58->share);
                        if ((CVar6 < CURLE_SETOPT_OPTION_SYNTAX) &&
                           ((0x1000000000011U >> ((ulong)CVar6 & 0x3f) & 1) != 0)) {
                          pFVar2 = (local_58->set).err;
                          if ((pFVar2 != (FILE *)0x0) && (pFVar2 != _stderr)) {
                            CVar6 = curl_easy_setopt(doh,CURLOPT_STDERR);
                            if ((CURLE_UNKNOWN_OPTION < CVar6) ||
                               ((0x1000000000011U >> ((ulong)CVar6 & 0x3f) & 1) == 0))
                            goto LAB_001238e1;
                          }
                          if ((((local_58->set).field_0x897 & 0x40) != 0) &&
                             (((pcVar3 = (local_58->state).feat, pcVar3 == (curl_trc_feat *)0x0 ||
                               (0 < pcVar3->log_level)) && (0 < Curl_trc_feat_dns.log_level)))) {
                            CVar6 = curl_easy_setopt(doh,CURLOPT_VERBOSE,1);
                            if ((CURLE_UNKNOWN_OPTION < CVar6) ||
                               ((0x1000000000011U >> ((ulong)CVar6 & 0x3f) & 1) == 0))
                            goto LAB_001238e1;
                          }
                          if (((local_58->set).field_0x898 & 2) != 0) {
                            CVar6 = curl_easy_setopt(doh,CURLOPT_NOSIGNAL,1);
                            if ((CURLE_UNKNOWN_OPTION < CVar6) ||
                               ((0x1000000000011U >> ((ulong)CVar6 & 0x3f) & 1) == 0))
                            goto LAB_001238e1;
                          }
                          CVar6 = curl_easy_setopt(doh,CURLOPT_SSL_VERIFYHOST,
                                                   (ulong)((uint)((ulong)*(undefined8 *)
                                                                          &(local_58->set).
                                                                           field_0x894 >> 0x33) & 2)
                                                  );
                          if ((CVar6 < CURLE_SETOPT_OPTION_SYNTAX) &&
                             ((0x1000000000011U >> ((ulong)CVar6 & 0x3f) & 1) != 0)) {
                            CVar6 = curl_easy_setopt(doh,CURLOPT_SSL_VERIFYPEER,
                                                     (ulong)((uint)((ulong)*(undefined8 *)
                                                                            &(local_58->set).
                                                                             field_0x894 >> 0x33) &
                                                            1));
                            pCVar4 = local_58;
                            if ((CVar6 < CURLE_SETOPT_OPTION_SYNTAX) &&
                               ((0x1000000000011U >> ((ulong)CVar6 & 0x3f) & 1) != 0)) {
                              CVar6 = curl_easy_setopt(doh,CURLOPT_SSL_VERIFYSTATUS,
                                                       (ulong)((uint)((ulong)*(undefined8 *)
                                                                              &(local_58->set).
                                                                               field_0x894 >> 0x35)
                                                              & 1));
                              if ((CVar6 < CURLE_SETOPT_OPTION_SYNTAX) &&
                                 ((0x1000000000011U >> ((ulong)CVar6 & 0x3f) & 1) != 0)) {
                                if (((pCVar4->set).ssl.field_0xc0 & 2) != 0) {
                                  CVar6 = curl_easy_setopt(doh,CURLOPT_SSL_FALSESTART,1);
                                  if ((CURLE_UNKNOWN_OPTION < CVar6) ||
                                     ((0x1000000000011U >> ((ulong)CVar6 & 0x3f) & 1) == 0))
                                  goto LAB_001238e1;
                                }
                                if ((local_58->set).str[6] != (char *)0x0) {
                                  CVar6 = curl_easy_setopt(doh,CURLOPT_CAINFO);
                                  if ((CURLE_UNKNOWN_OPTION < CVar6) ||
                                     ((0x1000000000011U >> ((ulong)CVar6 & 0x3f) & 1) == 0))
                                  goto LAB_001238e1;
                                }
                                if ((local_58->set).blobs[3] != (curl_blob *)0x0) {
                                  CVar6 = curl_easy_setopt(doh,CURLOPT_CAINFO_BLOB);
                                  if ((CURLE_UNKNOWN_OPTION < CVar6) ||
                                     ((0x1000000000011U >> ((ulong)CVar6 & 0x3f) & 1) == 0))
                                  goto LAB_001238e1;
                                }
                                if ((local_58->set).str[5] != (char *)0x0) {
                                  CVar6 = curl_easy_setopt(doh,CURLOPT_CAPATH);
                                  if ((CURLE_UNKNOWN_OPTION < CVar6) ||
                                     ((0x1000000000011U >> ((ulong)CVar6 & 0x3f) & 1) == 0))
                                  goto LAB_001238e1;
                                }
                                if ((local_58->set).str[10] != (char *)0x0) {
                                  CVar6 = curl_easy_setopt(doh,CURLOPT_CRLFILE);
                                  if ((CURLE_UNKNOWN_OPTION < CVar6) ||
                                     ((0x1000000000011U >> ((ulong)CVar6 & 0x3f) & 1) == 0))
                                  goto LAB_001238e1;
                                }
                                if (((local_58->set).ssl.field_0xc0 & 1) != 0) {
                                  CVar6 = curl_easy_setopt(doh,CURLOPT_CERTINFO,1);
                                  if ((CURLE_UNKNOWN_OPTION < CVar6) ||
                                     ((0x1000000000011U >> ((ulong)CVar6 & 0x3f) & 1) == 0))
                                  goto LAB_001238e1;
                                }
                                if ((local_58->set).ssl.fsslctx != (curl_ssl_ctx_callback)0x0) {
                                  CVar6 = curl_easy_setopt(doh,CURLOPT_SSL_CTX_FUNCTION);
                                  if ((CURLE_UNKNOWN_OPTION < CVar6) ||
                                     ((0x1000000000011U >> ((ulong)CVar6 & 0x3f) & 1) == 0))
                                  goto LAB_001238e1;
                                }
                                if ((local_58->set).ssl.fsslctxp != (void *)0x0) {
                                  CVar6 = curl_easy_setopt(doh,CURLOPT_SSL_CTX_DATA);
                                  if ((CURLE_UNKNOWN_OPTION < CVar6) ||
                                     ((0x1000000000011U >> ((ulong)CVar6 & 0x3f) & 1) == 0))
                                  goto LAB_001238e1;
                                }
                                if ((local_58->set).fdebug != (curl_debug_callback)0x0) {
                                  CVar6 = curl_easy_setopt(doh,CURLOPT_DEBUGFUNCTION);
                                  if ((CURLE_UNKNOWN_OPTION < CVar6) ||
                                     ((0x1000000000011U >> ((ulong)CVar6 & 0x3f) & 1) == 0))
                                  goto LAB_001238e1;
                                }
                                if ((local_58->set).debugdata != (void *)0x0) {
                                  CVar6 = curl_easy_setopt(doh,CURLOPT_DEBUGDATA);
                                  if ((CURLE_UNKNOWN_OPTION < CVar6) ||
                                     ((0x1000000000011U >> ((ulong)CVar6 & 0x3f) & 1) == 0))
                                  goto LAB_001238e1;
                                }
                                if ((local_58->set).str[0x43] != (char *)0x0) {
                                  CVar6 = curl_easy_setopt(doh,CURLOPT_SSL_EC_CURVES);
                                  if ((CURLE_UNKNOWN_OPTION < CVar6) ||
                                     ((0x1000000000011U >> ((ulong)CVar6 & 0x3f) & 1) == 0))
                                  goto LAB_001238e1;
                                }
                                pCVar4 = local_58;
                                curl_easy_setopt(doh,CURLOPT_SSL_OPTIONS,
                                                 (ulong)(*(ushort *)&(local_58->set).ssl.field_0xc0
                                                         >> 3 & 0x3f));
                                (doh->set).fmultidone = doh_done;
                                (doh->set).dohfor_mid = pCVar4->mid;
                                CVar7 = curl_multi_add_handle(local_40,doh);
                                if (CVar7 == CURLM_OK) {
                                  pdVar5->easy_mid = doh->mid;
                                  return CURLE_OK;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_001238e1:
  Curl_close(&doh);
  pdVar5->easy_mid = -1;
  return CVar6;
}

Assistant:

static CURLcode doh_run_probe(struct Curl_easy *data,
                              struct doh_probe *p, DNStype dnstype,
                              const char *host,
                              const char *url, CURLM *multi,
                              struct curl_slist *headers)
{
  struct Curl_easy *doh = NULL;
  CURLcode result = CURLE_OK;
  timediff_t timeout_ms;
  DOHcode d = doh_req_encode(host, dnstype, p->req_body, sizeof(p->req_body),
                             &p->req_body_len);
  if(d) {
    failf(data, "Failed to encode DoH packet [%d]", d);
    return CURLE_OUT_OF_MEMORY;
  }

  p->dnstype = dnstype;
  Curl_dyn_init(&p->resp_body, DYN_DOH_RESPONSE);

  timeout_ms = Curl_timeleft(data, NULL, TRUE);
  if(timeout_ms <= 0) {
    result = CURLE_OPERATION_TIMEDOUT;
    goto error;
  }
  /* Curl_open() is the internal version of curl_easy_init() */
  result = Curl_open(&doh);
  if(result)
    goto error;

  /* pass in the struct pointer via a local variable to please coverity and
     the gcc typecheck helpers */
  doh->state.internal = TRUE;
#ifndef CURL_DISABLE_VERBOSE_STRINGS
  doh->state.feat = &Curl_trc_feat_dns;
#endif
  ERROR_CHECK_SETOPT(CURLOPT_URL, url);
  ERROR_CHECK_SETOPT(CURLOPT_DEFAULT_PROTOCOL, "https");
  ERROR_CHECK_SETOPT(CURLOPT_WRITEFUNCTION, doh_write_cb);
  ERROR_CHECK_SETOPT(CURLOPT_WRITEDATA, &p->resp_body);
  ERROR_CHECK_SETOPT(CURLOPT_POSTFIELDS, p->req_body);
  ERROR_CHECK_SETOPT(CURLOPT_POSTFIELDSIZE, (long)p->req_body_len);
  ERROR_CHECK_SETOPT(CURLOPT_HTTPHEADER, headers);
#ifdef USE_HTTP2
  ERROR_CHECK_SETOPT(CURLOPT_HTTP_VERSION, CURL_HTTP_VERSION_2TLS);
  ERROR_CHECK_SETOPT(CURLOPT_PIPEWAIT, 1L);
#endif
#ifndef DEBUGBUILD
  /* enforce HTTPS if not debug */
  ERROR_CHECK_SETOPT(CURLOPT_PROTOCOLS, CURLPROTO_HTTPS);
#else
  /* in debug mode, also allow http */
  ERROR_CHECK_SETOPT(CURLOPT_PROTOCOLS, CURLPROTO_HTTP|CURLPROTO_HTTPS);
#endif
  ERROR_CHECK_SETOPT(CURLOPT_TIMEOUT_MS, (long)timeout_ms);
  ERROR_CHECK_SETOPT(CURLOPT_SHARE, (CURLSH *)data->share);
  if(data->set.err && data->set.err != stderr)
    ERROR_CHECK_SETOPT(CURLOPT_STDERR, data->set.err);
  if(Curl_trc_ft_is_verbose(data, &Curl_trc_feat_dns))
    ERROR_CHECK_SETOPT(CURLOPT_VERBOSE, 1L);
  if(data->set.no_signal)
    ERROR_CHECK_SETOPT(CURLOPT_NOSIGNAL, 1L);

  ERROR_CHECK_SETOPT(CURLOPT_SSL_VERIFYHOST,
    data->set.doh_verifyhost ? 2L : 0L);
  ERROR_CHECK_SETOPT(CURLOPT_SSL_VERIFYPEER,
    data->set.doh_verifypeer ? 1L : 0L);
  ERROR_CHECK_SETOPT(CURLOPT_SSL_VERIFYSTATUS,
    data->set.doh_verifystatus ? 1L : 0L);

  /* Inherit *some* SSL options from the user's transfer. This is a
     best-guess as to which options are needed for compatibility. #3661

     Note DoH does not inherit the user's proxy server so proxy SSL settings
     have no effect and are not inherited. If that changes then two new
     options should be added to check doh proxy insecure separately,
     CURLOPT_DOH_PROXY_SSL_VERIFYHOST and CURLOPT_DOH_PROXY_SSL_VERIFYPEER.
     */
  if(data->set.ssl.falsestart)
    ERROR_CHECK_SETOPT(CURLOPT_SSL_FALSESTART, 1L);
  if(data->set.str[STRING_SSL_CAFILE]) {
    ERROR_CHECK_SETOPT(CURLOPT_CAINFO,
                       data->set.str[STRING_SSL_CAFILE]);
  }
  if(data->set.blobs[BLOB_CAINFO]) {
    ERROR_CHECK_SETOPT(CURLOPT_CAINFO_BLOB,
                       data->set.blobs[BLOB_CAINFO]);
  }
  if(data->set.str[STRING_SSL_CAPATH]) {
    ERROR_CHECK_SETOPT(CURLOPT_CAPATH,
                       data->set.str[STRING_SSL_CAPATH]);
  }
  if(data->set.str[STRING_SSL_CRLFILE]) {
    ERROR_CHECK_SETOPT(CURLOPT_CRLFILE,
                       data->set.str[STRING_SSL_CRLFILE]);
  }
  if(data->set.ssl.certinfo)
    ERROR_CHECK_SETOPT(CURLOPT_CERTINFO, 1L);
  if(data->set.ssl.fsslctx)
    ERROR_CHECK_SETOPT(CURLOPT_SSL_CTX_FUNCTION, data->set.ssl.fsslctx);
  if(data->set.ssl.fsslctxp)
    ERROR_CHECK_SETOPT(CURLOPT_SSL_CTX_DATA, data->set.ssl.fsslctxp);
  if(data->set.fdebug)
    ERROR_CHECK_SETOPT(CURLOPT_DEBUGFUNCTION, data->set.fdebug);
  if(data->set.debugdata)
    ERROR_CHECK_SETOPT(CURLOPT_DEBUGDATA, data->set.debugdata);
  if(data->set.str[STRING_SSL_EC_CURVES]) {
    ERROR_CHECK_SETOPT(CURLOPT_SSL_EC_CURVES,
                       data->set.str[STRING_SSL_EC_CURVES]);
  }

  {
    long mask =
      (data->set.ssl.enable_beast ?
       CURLSSLOPT_ALLOW_BEAST : 0) |
      (data->set.ssl.no_revoke ?
       CURLSSLOPT_NO_REVOKE : 0) |
      (data->set.ssl.no_partialchain ?
       CURLSSLOPT_NO_PARTIALCHAIN : 0) |
      (data->set.ssl.revoke_best_effort ?
       CURLSSLOPT_REVOKE_BEST_EFFORT : 0) |
      (data->set.ssl.native_ca_store ?
       CURLSSLOPT_NATIVE_CA : 0) |
      (data->set.ssl.auto_client_cert ?
       CURLSSLOPT_AUTO_CLIENT_CERT : 0);

    (void)curl_easy_setopt(doh, CURLOPT_SSL_OPTIONS, mask);
  }

  doh->set.fmultidone = doh_done;
  doh->set.dohfor_mid = data->mid; /* for which transfer this is done */

  /* DoH handles must not inherit private_data. The handles may be passed to
     the user via callbacks and the user will be able to identify them as
     internal handles because private data is not set. The user can then set
     private_data via CURLOPT_PRIVATE if they so choose. */
  DEBUGASSERT(!doh->set.private_data);

  if(curl_multi_add_handle(multi, doh))
    goto error;

  p->easy_mid = doh->mid;
  return CURLE_OK;

error:
  Curl_close(&doh);
  p->easy_mid = -1;
  return result;
}